

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O3

void __thiscall Runtime::~Runtime(Runtime *this)

{
  VarEnv *this_00;
  _Fwd_list_node_base *p_Var1;
  forward_list<VarEnv_*,_std::allocator<VarEnv_*>_> *__range1;
  _Fwd_list_node_base *p_Var2;
  
  p_Var2 = (this->varEnvs).super__Fwd_list_base<VarEnv_*,_std::allocator<VarEnv_*>_>._M_impl._M_head
           ._M_next;
  if (p_Var2 != (_Fwd_list_node_base *)0x0) {
    do {
      this_00 = (VarEnv *)p_Var2[1]._M_next;
      if (this_00 != (VarEnv *)0x0) {
        VarEnv::~VarEnv(this_00);
        operator_delete(this_00);
      }
      p_Var2 = p_Var2->_M_next;
    } while (p_Var2 != (_Fwd_list_node_base *)0x0);
    p_Var2 = (this->varEnvs).super__Fwd_list_base<VarEnv_*,_std::allocator<VarEnv_*>_>._M_impl.
             _M_head._M_next;
    while (p_Var2 != (_Fwd_list_node_base *)0x0) {
      p_Var1 = p_Var2->_M_next;
      operator_delete(p_Var2);
      p_Var2 = p_Var1;
    }
  }
  (this->varEnvs).super__Fwd_list_base<VarEnv_*,_std::allocator<VarEnv_*>_>._M_impl._M_head._M_next
       = (_Fwd_list_node_base *)0x0;
  return;
}

Assistant:

Runtime::~Runtime() {
    for (auto &i: varEnvs) {
        if (i != NULL) {
            delete i;
        }
    }
}